

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool __thiscall
google::protobuf::Reflection::ContainsMapKey
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key)

{
  bool bVar1;
  MapFieldBase *pMVar2;
  UntypedMapBase *pUVar3;
  
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    pMVar2 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
    pUVar3 = (*(pMVar2->super_MapFieldBaseForParse).vtable_[1].get_map)
                       (&pMVar2->super_MapFieldBaseForParse,SUB81(key,0));
    return (bool)(char)pUVar3;
  }
  anon_unknown_6::ReportReflectionUsageError
            (this->descriptor_,field,"LookupMapValue","Field is not a map field.");
}

Assistant:

bool Reflection::ContainsMapKey(const Message& message,
                                const FieldDescriptor* field,
                                const MapKey& key) const {
  USAGE_CHECK(IsMapFieldInApi(field), LookupMapValue,
              "Field is not a map field.");
  return GetRaw<MapFieldBase>(message, field).ContainsMapKey(key);
}